

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiView.cpp
# Opt level: O2

void testMultiView(string *param_1)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Testing multi-view channel list functions");
  std::endl<char,std::char_traits<char>>(poVar1);
  anon_unknown.dwarf_21500f::testMultiViewFunctions();
  poVar1 = std::operator<<((ostream *)&std::cout,"ok\n");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void
testMultiView (const std::string&)
{
    try
    {
        cout << "Testing multi-view channel list functions" << endl;
        testMultiViewFunctions ();
        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}